

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O2

void ncnn::copy_make_border_image<signed_char>(Mat *src,Mat *dst,int top,int left,int type,char v)

{
  uint uVar1;
  int iVar2;
  int x_1;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  undefined1 *puVar7;
  size_t sVar8;
  int iVar9;
  ulong uVar10;
  void *pvVar11;
  int iVar12;
  long lVar13;
  undefined1 *puVar14;
  int iVar15;
  undefined1 *__src;
  undefined1 *__src_00;
  
  uVar1 = dst->w;
  lVar13 = (long)(int)uVar1;
  iVar2 = dst->h;
  __src_00 = (undefined1 *)src->data;
  pvVar11 = dst->data;
  lVar3 = (long)left;
  if (type == 0) {
    uVar10 = 0;
    if (0 < (int)uVar1) {
      uVar10 = (ulong)uVar1;
    }
    iVar15 = 0;
    iVar12 = 0;
    if (0 < top) {
      iVar15 = top;
      iVar12 = 0;
    }
    for (; iVar12 != iVar15; iVar12 = iVar12 + 1) {
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        *(char *)((long)pvVar11 + uVar4) = v;
      }
      pvVar11 = (void *)((long)pvVar11 + lVar13);
    }
    uVar4 = 0;
    if (0 < left) {
      uVar4 = (ulong)(uint)left;
    }
    for (; iVar15 < src->h + top; iVar15 = iVar15 + 1) {
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        *(char *)((long)pvVar11 + uVar6) = v;
      }
      sVar8 = (size_t)src->w;
      uVar6 = uVar4;
      if ((long)sVar8 < 0xc) {
        for (; (long)uVar6 < (long)((int)sVar8 + left); uVar6 = uVar6 + 1) {
          *(undefined1 *)((long)pvVar11 + uVar6) = __src_00[uVar6 - lVar3];
          sVar8 = (size_t)(uint)src->w;
        }
      }
      else {
        memcpy((void *)(lVar3 + (long)pvVar11),__src_00,sVar8);
        uVar6 = (ulong)(uint)(src->w + (int)uVar4);
      }
      for (lVar5 = (long)(int)uVar6; lVar5 < lVar13; lVar5 = lVar5 + 1) {
        *(char *)((long)pvVar11 + lVar5) = v;
      }
      __src_00 = __src_00 + src->w;
      pvVar11 = (void *)((long)pvVar11 + lVar13);
    }
    for (; iVar15 < iVar2; iVar15 = iVar15 + 1) {
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        *(char *)((long)pvVar11 + uVar4) = v;
      }
      pvVar11 = (void *)((long)pvVar11 + lVar13);
    }
  }
  else if (type == 1) {
    iVar15 = 0;
    uVar10 = 0;
    if (0 < left) {
      uVar10 = (ulong)(uint)left;
    }
    iVar12 = 0;
    if (0 < top) {
      iVar12 = top;
    }
    puVar14 = (undefined1 *)(uVar10 + (long)pvVar11);
    for (; iVar9 = (int)uVar10, iVar15 != iVar12; iVar15 = iVar15 + 1) {
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        *(undefined1 *)((long)pvVar11 + uVar4) = *__src_00;
      }
      sVar8 = (size_t)src->w;
      uVar4 = uVar10;
      if ((long)sVar8 < 0xc) {
        for (; (long)uVar4 < (long)((int)sVar8 + left); uVar4 = uVar4 + 1) {
          *(undefined1 *)((long)pvVar11 + uVar4) = __src_00[uVar4 - lVar3];
          sVar8 = (size_t)(uint)src->w;
        }
      }
      else {
        memcpy((void *)(lVar3 + (long)pvVar11),__src_00,sVar8);
        uVar4 = (ulong)(uint)(src->w + iVar9);
      }
      for (lVar5 = (long)(int)uVar4; lVar5 < lVar13; lVar5 = lVar5 + 1) {
        *(undefined1 *)((long)pvVar11 + lVar5) = __src_00[(long)src->w + -1];
      }
      pvVar11 = (void *)((long)pvVar11 + lVar13);
      puVar14 = puVar14 + lVar13;
    }
    for (; iVar12 < src->h + top; iVar12 = iVar12 + 1) {
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        *(undefined1 *)((long)pvVar11 + uVar4) = *__src_00;
      }
      sVar8 = (size_t)src->w;
      uVar4 = uVar10;
      if ((long)sVar8 < 0xc) {
        for (; (long)uVar4 < (long)((int)sVar8 + left); uVar4 = uVar4 + 1) {
          *(undefined1 *)((long)pvVar11 + uVar4) = __src_00[uVar4 - lVar3];
          sVar8 = (size_t)(uint)src->w;
        }
      }
      else {
        memcpy((void *)(lVar3 + (long)pvVar11),__src_00,sVar8);
        uVar4 = (ulong)(uint)(src->w + iVar9);
      }
      for (lVar5 = (long)(int)uVar4; lVar5 < lVar13; lVar5 = lVar5 + 1) {
        *(undefined1 *)((long)pvVar11 + lVar5) = __src_00[(long)src->w + -1];
      }
      __src_00 = __src_00 + src->w;
      pvVar11 = (void *)((long)pvVar11 + lVar13);
      puVar14 = puVar14 + lVar13;
    }
    iVar15 = src->w;
    __src = __src_00 + -(long)iVar15;
    for (; iVar12 < iVar2; iVar12 = iVar12 + 1) {
      for (uVar4 = 0; uVar10 != uVar4; uVar4 = uVar4 + 1) {
        *(undefined1 *)((long)pvVar11 + uVar4) = *__src;
      }
      sVar8 = (size_t)src->w;
      uVar4 = uVar10;
      puVar7 = puVar14;
      if ((long)sVar8 < 0xc) {
        for (; (long)uVar4 < (long)((int)sVar8 + left); uVar4 = uVar4 + 1) {
          *puVar7 = __src_00[uVar4 - (iVar15 + lVar3)];
          sVar8 = (size_t)(uint)src->w;
          puVar7 = puVar7 + 1;
        }
      }
      else {
        memcpy((void *)(lVar3 + (long)pvVar11),__src,sVar8);
        uVar4 = (ulong)(uint)(src->w + iVar9);
      }
      for (lVar5 = (long)(int)uVar4; lVar5 < lVar13; lVar5 = lVar5 + 1) {
        *(undefined1 *)((long)pvVar11 + lVar5) = __src[(long)src->w + -1];
      }
      pvVar11 = (void *)((long)pvVar11 + lVar13);
      puVar14 = puVar14 + lVar13;
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }
    else if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }
}